

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTcParser::finish_local_ctx(CTcParser *this,CTPNCodeBody *cb,CTcPrsSymtab *local_symtab)

{
  long in_RDX;
  CTPNCodeBodyBase *in_RSI;
  CTcPrsSymtab *in_RDI;
  bool bVar1;
  enum_locals_ctx ctx;
  CTcPrsSymtab *par;
  CTcPrsSymtab *tab;
  uint7 in_stack_ffffffffffffffb8;
  CTcPrsSymtab *local_28;
  
  if (((ulong)in_RDI[10].parent_ & 1) != 0) {
    CTPNCodeBodyBase::set_local_ctx
              (in_RSI,*(int *)((long)&in_RDI[10].parent_ + 4),
               *(int *)&in_RDI[0xb]._vptr_CTcPrsSymtab + -1);
  }
  if (in_RDX != 0) {
    local_28 = CTcPrsSymtab::get_parent(in_RDI[5].parent_);
    while( true ) {
      bVar1 = false;
      if (local_28 != (CTcPrsSymtab *)0x0) {
        bVar1 = local_28 != in_RDI[2].list_next_;
      }
      if (!bVar1) break;
      local_28 = CTcPrsSymtab::get_parent(local_28);
    }
    CTcPrsSymtab::enum_entries
              (in_RDI,(_func_void_void_ptr_CTcSymbol_ptr *)(ulong)in_stack_ffffffffffffffb8,
               (void *)0x2b860e);
  }
  return;
}

Assistant:

void CTcParser::finish_local_ctx(CTPNCodeBody *cb, CTcPrsSymtab *local_symtab)
{
    /* if we have a local context, mark the code body accordingly */
    if (has_local_ctx_)
        cb->set_local_ctx(local_ctx_var_num_, next_ctx_arr_idx_ - 1);

    /* 
     *   If the caller passed in a local symbol table, check the table for
     *   context variables from enclosing scopes, and assign the local holder
     *   for each such variable. 
     */
    if (local_symtab != 0)
    {
        /* 
         *   consider only the outermost local table, since that's where the
         *   shared locals reside 
         */
        CTcPrsSymtab *tab, *par;
        for (tab = local_symtab_, par = tab->get_parent() ;
             par != 0 && par != global_symtab_ ;
             tab = par, par = par->get_parent()) ;

        /* enumerate the variables */
        enum_locals_ctx ctx;
        ctx.symtab = tab;
        ctx.code_body = cb;
        tab->enum_entries(&enum_for_ctx_locals, &ctx);
    }
}